

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  string *psVar1;
  string *in_RDI;
  error_fetch_and_normalize local_50;
  
  error_fetch_and_normalize::error_fetch_and_normalize(&local_50,"pybind11::detail::error_string");
  psVar1 = error_fetch_and_normalize::error_string_abi_cxx11_(&local_50);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  error_fetch_and_normalize::~error_fetch_and_normalize(&local_50);
  return in_RDI;
}

Assistant:

inline std::string error_string() {
    return error_fetch_and_normalize("pybind11::detail::error_string").error_string();
}